

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdm.hpp
# Opt level: O1

void __thiscall
wdm::Indep_test::Indep_test
          (Indep_test *this,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y,string *method,
          vector<double,_std::allocator<double>_> *weights,bool remove_missing,string *alternative)

{
  pointer pcVar1;
  pointer pdVar2;
  pointer pdVar3;
  Indep_test *this_00;
  int iVar4;
  long lVar5;
  size_type sVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  vector<double,_std::allocator<double>_> res;
  allocator_type local_191;
  vector<double,_std::allocator<double>_> *local_190;
  string *local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  Indep_test *local_168;
  string local_160;
  double local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  string *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  value_type_conflict local_120;
  vector<double,_std::allocator<double>_> local_118;
  vector<double,_std::allocator<double>_> local_100;
  vector<double,_std::allocator<double>_> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_128 = &(this->method_).field_2;
  (this->method_)._M_dataplus._M_p = (pointer)local_128;
  pcVar1 = (method->_M_dataplus)._M_p;
  local_188 = method;
  local_168 = this;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + method->_M_string_length)
  ;
  local_130 = &this->alternative_;
  local_138 = &(this->alternative_).field_2;
  (this->alternative_)._M_dataplus._M_p = (pointer)local_138;
  pcVar1 = (alternative->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,pcVar1,pcVar1 + alternative->_M_string_length);
  local_190 = y;
  utils::check_sizes(x,y,weights);
  pcVar1 = (local_188->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + local_188->_M_string_length);
  utils::preproc(&local_160,x,local_190,weights,&local_50,remove_missing);
  iVar4 = std::__cxx11::string::compare((char *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this_00 = local_168;
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (iVar4 == 0) {
    lVar5 = (long)pdVar3 - (long)pdVar2;
    if (lVar5 == 0) {
      lVar5 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      lVar7 = lVar5 >> 3;
      auVar11._8_4_ = (int)(lVar5 >> 0x23);
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = 0x45300000;
      dVar12 = (auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
    }
    else {
      sVar6 = lVar5 >> 3;
      local_188 = (string *)0x0;
      lVar5 = 0;
      do {
        local_188 = (string *)((double)local_188 + pdVar2[lVar5]);
        lVar5 = lVar5 + 1;
      } while (sVar6 + (sVar6 == 0) != lVar5);
      uStack_180 = 0;
      local_120 = 1.0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_160,sVar6,&local_120,&local_191);
      pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar2;
      if (lVar5 != 0) {
        lVar5 = lVar5 >> 3;
        lVar7 = 0;
        do {
          lVar8 = 2;
          do {
            *(double *)(local_160._M_dataplus._M_p + lVar7 * 8) =
                 pdVar2[lVar7] * *(double *)(local_160._M_dataplus._M_p + lVar7 * 8);
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar5 + (ulong)(lVar5 == 0));
      }
      if (local_160._M_string_length - (long)local_160._M_dataplus._M_p == 0) {
        local_190 = (vector<double,_std::allocator<double>_> *)0x0;
      }
      else {
        lVar5 = (long)(local_160._M_string_length - (long)local_160._M_dataplus._M_p) >> 3;
        local_190 = (vector<double,_std::allocator<double>_> *)0x0;
        lVar7 = 0;
        do {
          local_190 = (vector<double,_std::allocator<double>_> *)
                      ((double)local_190 + *(double *)(local_160._M_dataplus._M_p + lVar7 * 8));
          lVar7 = lVar7 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
      }
      local_188 = (string *)((double)local_188 * (double)local_188);
      if (local_160._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      dVar12 = (double)local_188 / (double)local_190;
    }
    this_00->n_eff_ = dVar12;
    this_00->estimate_ = NAN;
    this_00->statistic_ = NAN;
    this_00->p_value_ = NAN;
  }
  else {
    lVar5 = (long)pdVar3 - (long)pdVar2;
    if (lVar5 == 0) {
      lVar5 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      lVar7 = lVar5 >> 3;
      auVar10._8_4_ = (int)(lVar5 >> 0x23);
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = 0x45300000;
      dVar12 = (auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
    }
    else {
      sVar6 = lVar5 >> 3;
      local_178 = 0.0;
      lVar5 = 0;
      do {
        local_178 = local_178 + pdVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (sVar6 + (sVar6 == 0) != lVar5);
      uStack_170 = 0;
      local_120 = 1.0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_160,sVar6,&local_120,&local_191);
      pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar2;
      if (lVar5 != 0) {
        lVar5 = lVar5 >> 3;
        lVar7 = 0;
        do {
          lVar8 = 2;
          do {
            *(double *)(local_160._M_dataplus._M_p + lVar7 * 8) =
                 pdVar2[lVar7] * *(double *)(local_160._M_dataplus._M_p + lVar7 * 8);
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar5 + (ulong)(lVar5 == 0));
      }
      if (local_160._M_string_length - (long)local_160._M_dataplus._M_p == 0) {
        dVar9 = 0.0;
      }
      else {
        lVar5 = (long)(local_160._M_string_length - (long)local_160._M_dataplus._M_p) >> 3;
        dVar9 = 0.0;
        lVar7 = 0;
        do {
          dVar9 = dVar9 + *(double *)(local_160._M_dataplus._M_p + lVar7 * 8);
          lVar7 = lVar7 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
      }
      dVar12 = local_178 * local_178;
      if (local_160._M_dataplus._M_p != (pointer)0x0) {
        local_178 = local_178 * local_178;
        local_140 = dVar9;
        operator_delete(local_160._M_dataplus._M_p);
        dVar12 = local_178;
        dVar9 = local_140;
      }
      dVar12 = dVar12 / dVar9;
    }
    this_00->n_eff_ = dVar12;
    std::vector<double,_std::allocator<double>_>::vector(&local_e8,x);
    std::vector<double,_std::allocator<double>_>::vector(&local_100,local_190);
    pcVar1 = (local_188->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + local_188->_M_string_length);
    std::vector<double,_std::allocator<double>_>::vector(&local_118,weights);
    dVar12 = wdm(&local_e8,&local_100,&local_70,&local_118,false);
    this_00->estimate_ = dVar12;
    if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_178 = this_00->estimate_;
    pcVar1 = (local_188->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + local_188->_M_string_length);
    dVar12 = compute_test_stat(this_00,local_178,&local_90,this_00->n_eff_,x,local_190,weights);
    this_00->statistic_ = dVar12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_190 = (vector<double,_std::allocator<double>_> *)this_00->statistic_;
    pcVar1 = (local_188->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + local_188->_M_string_length);
    pcVar1 = (alternative->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + alternative->_M_string_length);
    dVar12 = compute_p_value(this_00,(double)local_190,&local_b0,&local_d0,this_00->n_eff_);
    this_00->p_value_ = dVar12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

Indep_test(std::vector<double> x,
               std::vector<double> y,
               std::string method,
               std::vector<double> weights = std::vector<double>(),
               bool remove_missing = true,
               std::string alternative = "two-sided") :
        method_(method),
        alternative_(alternative)
    {
        utils::check_sizes(x, y, weights);
        if (utils::preproc(x, y, weights, method, remove_missing) == "return_nan") {
            n_eff_ = utils::effective_sample_size(x.size(), weights);
            estimate_  = std::numeric_limits<double>::quiet_NaN();
            statistic_ = std::numeric_limits<double>::quiet_NaN();
            p_value_   = std::numeric_limits<double>::quiet_NaN();
        } else {
            n_eff_ = utils::effective_sample_size(x.size(), weights);
            estimate_ = wdm(x, y, method, weights, false);
            statistic_ = compute_test_stat(estimate_, method, n_eff_, x, y, weights);
            p_value_ = compute_p_value(statistic_, method, alternative, n_eff_);
        }
    }